

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O2

double __thiscall Geodesic::getDist(Geodesic *this)

{
  pointer pPVar1;
  PhyloTreeEdge *commonEdge;
  pointer this_00;
  double dVar2;
  double dVar3;
  RatioSequence local_38;
  
  pPVar1 = (this->commonEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  dVar3 = 0.0;
  for (this_00 = (this->commonEdges).
                 super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1) {
    dVar2 = PhyloTreeEdge::getLength(this_00);
    dVar3 = dVar3 + dVar2 * dVar2;
  }
  RatioSequence::getNonDesRSWithMinDist(&local_38,&this->rs);
  dVar2 = RatioSequence::getDistance(&local_38);
  dVar3 = dVar3 + dVar2 * dVar2 + this->leafContributionSquared;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_38._RatioSequence);
  return dVar3;
}

Assistant:

double Geodesic::getDist() {
    double commonEdgeDistSquared = 0;
    for (auto & commonEdge : commonEdges) {
        commonEdgeDistSquared += pow(commonEdge.getLength(), 2);
    }
    return sqrt(pow(rs.getNonDesRSWithMinDist().getDistance(), 2) + commonEdgeDistSquared + leafContributionSquared);
}